

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O2

void oonf_rfc5444_reconfigure_protocol(oonf_rfc5444_protocol *protocol,uint16_t port,int ip_proto)

{
  uint16_t uVar1;
  ulong uVar2;
  undefined6 in_register_00000032;
  list_entity *plVar3;
  
  uVar2 = CONCAT62(in_register_00000032,port) & 0xffffffff;
  uVar1 = (uint16_t)uVar2;
  if ((protocol->port != uVar1) || (protocol->ip_proto != ip_proto)) {
    if ((log_global_mask[_oonf_rfc5444_subsystem.logging] & 2) != 0) {
      oonf_log(LOG_SEVERITY_INFO,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x20f,
               (void *)0x0,0,"Reconfigure protocol %s to port %u and ip-protocol %d",protocol,uVar2,
               (ulong)(uint)ip_proto);
    }
    protocol->port = uVar1;
    protocol->ip_proto = ip_proto;
    plVar3 = &(protocol->_interface_tree).list_head;
    while (plVar3 = ((list_entity *)&plVar3->next)->next,
          plVar3->prev != (protocol->_interface_tree).list_head.prev) {
      oonf_packet_remove_managed((oonf_packet_managed *)(plVar3 + 7),true);
      oonf_packet_add_managed((oonf_packet_managed *)(plVar3 + 7));
      if (uVar1 != 0) {
        oonf_rfc5444_reconfigure_interface
                  ((oonf_rfc5444_interface *)&(plVar3 + -3)[1].prev,
                   (oonf_packet_managed_config *)0x0);
      }
    }
  }
  return;
}

Assistant:

void
oonf_rfc5444_reconfigure_protocol(struct oonf_rfc5444_protocol *protocol, uint16_t port, int ip_proto) {
  struct oonf_rfc5444_interface *interf;

  /* nothing to do? */
  if (port == protocol->port && ip_proto == protocol->ip_proto) {
    return;
  }

  OONF_INFO(LOG_RFC5444, "Reconfigure protocol %s to port %u and ip-protocol %d", protocol->name, port, ip_proto);

  /* store protocol port */
  protocol->port = port;
  protocol->ip_proto = ip_proto;

  avl_for_each_element(&protocol->_interface_tree, interf, _node) {
    oonf_packet_remove_managed(&interf->_socket, true);
    oonf_packet_add_managed(&interf->_socket);

    if (port) {
      oonf_rfc5444_reconfigure_interface(interf, NULL);
    }
  }
}